

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

bool __thiscall VcprojGenerator::writeMakefile(VcprojGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  XmlOutput xmlOut;
  QArrayDataPointer<char16_t> local_c8 [2];
  ProString local_98;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
    _vptr_QMakeSourceFileInfo[0x2a])();
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_68,"TEMPLATE");
  QMakeEvaluator::first((ProString *)&xmlOut,&pQVar1->super_QMakeEvaluator,&local_68);
  bVar2 = ProString::operator==((ProString *)&xmlOut,"vcsubdirs");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlOut);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (bVar2) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)&xmlOut,"build_pass");
    bVar2 = QMakeProject::isActiveConfig(pQVar1,(QString *)&xmlOut,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlOut);
    if (bVar2) {
      bVar2 = true;
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Not writing solution file for build_pass configs"
                          );
      }
    }
    else {
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Writing solution file");
      }
      writeSubDirs(this,t);
      bVar2 = true;
    }
  }
  else {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_68,"TEMPLATE");
    QMakeEvaluator::first((ProString *)&xmlOut,&pQVar1->super_QMakeEvaluator,&local_68);
    bVar2 = ProString::operator==((ProString *)&xmlOut,"vcapp");
    if (bVar2) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlOut);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    }
    else {
      pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
      ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
      QMakeEvaluator::first(&local_98,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
      bVar2 = ProString::operator==(&local_98,"vclib");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlOut);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      if (!bVar2) {
        pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
        QString::QString((QString *)&xmlOut,"build_pass");
        bVar2 = QMakeProject::isActiveConfig(pQVar1,(QString *)&xmlOut,false);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlOut);
        goto LAB_001c57da;
      }
    }
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString((QString *)&xmlOut,"build_pass");
    bVar3 = QMakeProject::isActiveConfig(pQVar1,(QString *)&xmlOut,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&xmlOut);
    bVar2 = true;
    if (!bVar3) {
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Writing single configuration project file");
      }
      xmlOut.tagStack.super_QList<QString>.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
      xmlOut.tagStack.super_QList<QString>.d.size = -0x5555555555555556;
      xmlOut.format = 0xaaaaaaaa;
      xmlOut.conversion = 0xaaaaaaaa;
      xmlOut.tagStack.super_QList<QString>.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      xmlOut.currentIndent.d.size = -0x5555555555555556;
      xmlOut.currentLevel = -0x55555556;
      xmlOut.currentState = 0xaaaaaaaa;
      xmlOut.currentIndent.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      xmlOut.currentIndent.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      xmlOut.indent.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      xmlOut.indent.d.size = -0x5555555555555556;
      xmlOut.xmlFile = (QTextStream *)0xaaaaaaaaaaaaaaaa;
      xmlOut.indent.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      XmlOutput::XmlOutput(&xmlOut,t,XMLConversion);
      (*this->projectWriter->_vptr_VCProjectWriter[2])(this->projectWriter,&xmlOut,&this->vcProject)
      ;
      XmlOutput::~XmlOutput(&xmlOut);
    }
  }
LAB_001c57da:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool VcprojGenerator::writeMakefile(QTextStream &t)
{
    initProject(); // Fills the whole project with proper data

    // Generate solution file
    if(project->first("TEMPLATE") == "vcsubdirs") {
        if (!project->isActiveConfig("build_pass")) {
            debug_msg(1, "Generator: MSVC.NET: Writing solution file");
            writeSubDirs(t);
        } else {
            debug_msg(1, "Generator: MSVC.NET: Not writing solution file for build_pass configs");
        }
        return true;
    } else
    // Generate single configuration project file
    if (project->first("TEMPLATE") == "vcapp" ||
        project->first("TEMPLATE") == "vclib") {
        if(!project->isActiveConfig("build_pass")) {
            debug_msg(1, "Generator: MSVC.NET: Writing single configuration project file");
            XmlOutput xmlOut(t);
            projectWriter->write(xmlOut, vcProject);
        }
        return true;
    }
    return project->isActiveConfig("build_pass");
}